

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  Allocator *pAVar7;
  pointer pMVar8;
  long *plVar9;
  DataReader *pDVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  Layer *pLVar13;
  undefined4 extraout_var_00;
  size_t sVar14;
  undefined4 extraout_var_01;
  Layer *pLVar15;
  undefined4 extraout_var_02;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar16;
  long lVar17;
  pointer pBVar18;
  size_t *psVar19;
  Net *pNVar20;
  int *piVar21;
  long lVar22;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  ParamDict pd;
  int magic;
  Option opt1;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  int local_40c;
  Net *local_408;
  int local_400;
  char local_3f9;
  long local_3f8;
  Layer *local_3f0;
  vector<int,_std::allocator<int>_> *local_3e8;
  int local_3e0;
  int local_3dc;
  ulong local_3d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_3d0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_3c8;
  DataReader *local_3c0;
  vector<int,_std::allocator<int>_> *local_3b8;
  ParamDict local_3b0;
  int local_39c;
  undefined1 local_398 [32];
  Allocator *local_378;
  int iStack_370;
  int local_36c;
  int iStack_368;
  int iStack_364;
  int iStack_360;
  size_t local_358;
  Option *local_350;
  string *local_348;
  string *local_340;
  Mat local_338 [3];
  char local_238 [256];
  char local_138 [264];
  
  local_39c = 0;
  iVar11 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar11 != 1) {
    load_param();
    return -1;
  }
  if (local_39c != 0x7685dd) {
    load_param();
    return -1;
  }
  local_3dc = 0;
  local_3e0 = 0;
  iVar11 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar11 != 1) {
    load_param();
    return -1;
  }
  iVar11 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3e0);
  if (iVar11 != 1) {
    load_param();
    return -1;
  }
  if (((long)local_3dc < 1) || (local_3e0 < 1)) {
    load_param();
    return -1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
            (&this->d->layers,(long)local_3dc);
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(&this->d->blobs,(long)local_3e0);
  ParamDict::ParamDict(&local_3b0);
  if (0 < local_3dc) {
    local_350 = &this->opt;
    local_3f8 = 0;
    local_3d8 = 0;
    local_408 = this;
    local_3c0 = dr;
    do {
      pDVar10 = local_3c0;
      psVar19 = &local_338[0].elemsize;
      local_400 = 0;
      local_40c = 0;
      iVar11 = (*local_3c0->_vptr_DataReader[2])(local_3c0,"%255s",local_238);
      if (iVar11 == 1) {
        iVar11 = (*pDVar10->_vptr_DataReader[2])(pDVar10,"%255s",local_138);
        if (iVar11 != 1) {
          load_param();
          goto LAB_0013b598;
        }
        iVar11 = (*pDVar10->_vptr_DataReader[2])(pDVar10,"%d",&local_400);
        if (iVar11 != 1) {
          load_param();
          goto LAB_0013b598;
        }
        iVar11 = (*pDVar10->_vptr_DataReader[2])(pDVar10,"%d",&local_40c);
        if (iVar11 != 1) {
          load_param();
          goto LAB_0013b598;
        }
        iVar11 = (*local_408->_vptr_Net[4])(local_408,local_238);
        pLVar13 = (Layer *)CONCAT44(extraout_var,iVar11);
        if (pLVar13 == (Layer *)0x0) {
          pLVar13 = create_layer_cpu(local_238);
        }
        if (pLVar13 == (Layer *)0x0) {
          iVar11 = (*local_408->_vptr_Net[3])(local_408,local_238);
          pLVar13 = (Layer *)CONCAT44(extraout_var_00,iVar11);
        }
        if (pLVar13 == (Layer *)0x0) {
          fprintf(_stderr,"layer %s not exists or registered",local_238);
          fputc(10,_stderr);
          clear(local_408);
          iVar11 = 1;
        }
        else {
          local_338[0].data = psVar19;
          sVar14 = strlen(local_238);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_338,local_238,local_238 + sVar14);
          local_340 = &pLVar13->type;
          local_3f0 = pLVar13;
          std::__cxx11::string::operator=((string *)local_340,(string *)local_338);
          if ((size_t *)local_338[0].data != psVar19) {
            operator_delete(local_338[0].data,
                            CONCAT44(local_338[0].elemsize._4_4_,(undefined4)local_338[0].elemsize)
                            + 1);
          }
          local_338[0].data = psVar19;
          sVar14 = strlen(local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_338,local_138,local_138 + sVar14);
          pLVar13 = local_3f0;
          local_348 = &local_3f0->name;
          std::__cxx11::string::operator=((string *)local_348,(string *)local_338);
          if ((size_t *)local_338[0].data != psVar19) {
            operator_delete(local_338[0].data,
                            CONCAT44(local_338[0].elemsize._4_4_,(undefined4)local_338[0].elemsize)
                            + 1);
          }
          local_3b8 = &pLVar13->bottoms;
          std::vector<int,_std::allocator<int>_>::resize(local_3b8,(long)local_400);
          local_3e8 = (vector<int,_std::allocator<int>_> *)CONCAT71(local_3e8._1_7_,0 < local_400);
          iVar11 = 0x19;
          if (0 < local_400) {
            lVar17 = 0;
            pNVar20 = local_408;
            do {
              iVar11 = (*local_3c0->_vptr_DataReader[2])(local_3c0,"%255s",local_338);
              if (iVar11 == 1) {
                iVar12 = find_blob_index_by_name(pNVar20,(char *)local_338);
                if (iVar12 == -1) {
                  pBVar18 = (pNVar20->d->blobs).
                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  local_398._0_8_ = local_398 + 0x10;
                  sVar14 = strlen((char *)local_338);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_398,local_338,(long)&local_338[0].data + sVar14);
                  std::__cxx11::string::operator=
                            ((string *)(pBVar18 + (int)local_3d8),(string *)local_398);
                  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                    operator_delete((void *)local_398._0_8_,
                                    CONCAT44(local_398._20_4_,local_398._16_4_) + 1);
                  }
                  iVar12 = (int)local_3d8;
                  local_3d8 = (ulong)(iVar12 + 1);
                  pLVar13 = local_3f0;
                  pNVar20 = local_408;
                }
                (pNVar20->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar12].consumer = (int)local_3f8;
                (local_3b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar17] = iVar12;
              }
              else {
                load_param();
              }
              if (iVar11 != 1) {
                iVar11 = 1;
                goto LAB_0013b361;
              }
              lVar17 = lVar17 + 1;
              local_3e8 = (vector<int,_std::allocator<int>_> *)
                          CONCAT71(local_3e8._1_7_,lVar17 < local_400);
            } while (lVar17 < local_400);
            iVar11 = 0x19;
          }
LAB_0013b361:
          if (((ulong)local_3e8 & 1) == 0) {
            local_3e8 = &pLVar13->tops;
            std::vector<int,_std::allocator<int>_>::resize(local_3e8,(long)local_40c);
            local_3c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                        CONCAT71(local_3c8._1_7_,0 < local_40c);
            iVar11 = 0x1e;
            if (0 < local_40c) {
              lVar17 = 0;
              pNVar20 = local_408;
              do {
                pBVar18 = (pNVar20->d->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_3d8;
                iVar11 = (*local_3c0->_vptr_DataReader[2])(local_3c0,"%255s",local_338);
                if (iVar11 == 1) {
                  local_398._0_8_ = local_398 + 0x10;
                  sVar14 = strlen((char *)local_338);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_398,local_338,(long)&local_338[0].data + sVar14);
                  std::__cxx11::string::operator=((string *)pBVar18,(string *)local_398);
                  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                    operator_delete((void *)local_398._0_8_,
                                    CONCAT44(local_398._20_4_,local_398._16_4_) + 1);
                  }
                  pBVar18->producer = (int)local_3f8;
                  (local_3e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar17] = (int)local_3d8;
                  local_3d8 = (ulong)((int)local_3d8 + 1);
                  pNVar20 = local_408;
                }
                else {
                  load_param();
                }
                pLVar13 = local_3f0;
                if (iVar11 != 1) {
                  iVar11 = 1;
                  goto LAB_0013b4c8;
                }
                lVar17 = lVar17 + 1;
                local_3c8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                            CONCAT71(local_3c8._1_7_,lVar17 < local_40c);
              } while (lVar17 < local_40c);
              iVar11 = 0x1e;
            }
LAB_0013b4c8:
            if (((ulong)local_3c8 & 1) == 0) {
              bVar2 = pLVar13->support_vulkan;
              iVar11 = ParamDict::load_param(&local_3b0,local_3c0);
              if (iVar11 == 0) {
                local_358 = 0;
                local_398._0_8_ = (void *)0x0;
                local_398._8_4_ = 0;
                local_398._12_4_ = 0;
                local_398._16_4_ = 0;
                local_398._20_4_ = 0;
                local_398._24_4_ = 0;
                iStack_368 = 0;
                iStack_364 = 0;
                iStack_360 = 0;
                local_378 = (Allocator *)0x0;
                iStack_370 = 0;
                local_36c = 0;
                ParamDict::get(local_338,&local_3b0,0x1e,(Mat *)local_398);
                pNVar20 = local_408;
                piVar21 = (int *)CONCAT44(local_398._12_4_,local_398._8_4_);
                if (piVar21 != (int *)0x0) {
                  LOCK();
                  *piVar21 = *piVar21 + -1;
                  UNLOCK();
                  if (*piVar21 == 0) {
                    if (local_378 == (Allocator *)0x0) {
                      if ((void *)local_398._0_8_ != (void *)0x0) {
                        free((void *)local_398._0_8_);
                      }
                    }
                    else {
                      (*local_378->_vptr_Allocator[3])();
                    }
                  }
                }
                local_358 = 0;
                local_398._0_8_ = (undefined1 *)0x0;
                local_398._8_4_ = 0;
                local_398._12_4_ = 0;
                local_398._16_4_ = 0;
                local_398._20_4_ = 0;
                local_398._24_4_ = 0;
                iStack_370 = 0;
                local_36c = 0;
                iStack_368 = 0;
                iStack_364 = 0;
                iStack_360 = 0;
                local_3f9 = bVar2;
                if ((((size_t *)local_338[0].data != (size_t *)0x0) &&
                    ((long)local_338[0].c * local_338[0].cstep != 0)) && (0 < local_40c)) {
                  piVar21 = (int *)((long)local_338[0].data + 0xc);
                  lVar17 = 0;
                  do {
                    iVar11 = (local_3e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar17];
                    pBVar18 = (pNVar20->d->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    iVar12 = piVar21[-3];
                    if (iVar12 == 3) {
                      iVar12 = piVar21[-2];
                      iVar3 = piVar21[-1];
                      iVar4 = *piVar21;
                      piVar5 = pBVar18[iVar11].shape.refcount;
                      if (piVar5 != (int *)0x0) {
                        LOCK();
                        *piVar5 = *piVar5 + -1;
                        UNLOCK();
                        if (*piVar5 == 0) {
                          pvVar6 = pBVar18[iVar11].shape.data;
                          pAVar7 = pBVar18[iVar11].shape.allocator;
                          if (pAVar7 == (Allocator *)0x0) {
                            if (pvVar6 != (void *)0x0) {
                              free(pvVar6);
                            }
                          }
                          else {
                            (*pAVar7->_vptr_Allocator[3])();
                          }
                        }
                      }
                      pBVar18[iVar11].shape.cstep = 0;
                      *(undefined8 *)((long)&pBVar18[iVar11].shape.refcount + 4) = 0;
                      *(undefined8 *)((long)&pBVar18[iVar11].shape.elemsize + 4) = 0;
                      pBVar18[iVar11].shape.data = (void *)0x0;
                      pBVar18[iVar11].shape.refcount = (int *)0x0;
                      pBVar18[iVar11].shape.dims = 0;
                      pBVar18[iVar11].shape.w = 0;
                      pBVar18[iVar11].shape.h = 0;
                      pBVar18[iVar11].shape.d = 0;
                      pBVar18[iVar11].shape.elemsize = 4;
                      pBVar18[iVar11].shape.elempack = 1;
                      pBVar18[iVar11].shape.allocator = (Allocator *)0x0;
                      pBVar18[iVar11].shape.dims = 3;
                      pBVar18[iVar11].shape.w = iVar12;
                      pBVar18[iVar11].shape.h = iVar3;
                      pBVar18[iVar11].shape.d = 1;
                      pBVar18[iVar11].shape.c = iVar4;
                      pBVar18[iVar11].shape.cstep =
                           (long)iVar3 * (long)iVar12 + 3U & 0x3ffffffffffffffc;
                      pNVar20 = local_408;
                    }
                    else if (iVar12 == 2) {
                      iVar12 = piVar21[-2];
                      iVar3 = piVar21[-1];
                      piVar5 = pBVar18[iVar11].shape.refcount;
                      if (piVar5 != (int *)0x0) {
                        LOCK();
                        *piVar5 = *piVar5 + -1;
                        UNLOCK();
                        if (*piVar5 == 0) {
                          pvVar6 = pBVar18[iVar11].shape.data;
                          pAVar7 = pBVar18[iVar11].shape.allocator;
                          if (pAVar7 == (Allocator *)0x0) {
                            if (pvVar6 != (void *)0x0) {
                              free(pvVar6);
                            }
                          }
                          else {
                            (*pAVar7->_vptr_Allocator[3])();
                          }
                        }
                      }
                      pBVar18[iVar11].shape.cstep = 0;
                      *(undefined8 *)((long)&pBVar18[iVar11].shape.refcount + 4) = 0;
                      *(undefined8 *)((long)&pBVar18[iVar11].shape.elemsize + 4) = 0;
                      pBVar18[iVar11].shape.data = (void *)0x0;
                      pBVar18[iVar11].shape.refcount = (int *)0x0;
                      pBVar18[iVar11].shape.dims = 0;
                      pBVar18[iVar11].shape.w = 0;
                      pBVar18[iVar11].shape.h = 0;
                      pBVar18[iVar11].shape.d = 0;
                      pBVar18[iVar11].shape.elemsize = 4;
                      pBVar18[iVar11].shape.elempack = 1;
                      pBVar18[iVar11].shape.allocator = (Allocator *)0x0;
                      pBVar18[iVar11].shape.dims = 2;
                      pBVar18[iVar11].shape.w = iVar12;
                      pBVar18[iVar11].shape.h = iVar3;
                      pBVar18[iVar11].shape.d = 1;
                      pBVar18[iVar11].shape.c = 1;
                      pBVar18[iVar11].shape.cstep = (long)iVar3 * (long)iVar12;
                      pNVar20 = local_408;
                    }
                    else if (iVar12 == 1) {
                      iVar12 = piVar21[-2];
                      piVar5 = pBVar18[iVar11].shape.refcount;
                      if (piVar5 != (int *)0x0) {
                        LOCK();
                        *piVar5 = *piVar5 + -1;
                        UNLOCK();
                        if (*piVar5 == 0) {
                          pvVar6 = pBVar18[iVar11].shape.data;
                          pAVar7 = pBVar18[iVar11].shape.allocator;
                          if (pAVar7 == (Allocator *)0x0) {
                            if (pvVar6 != (void *)0x0) {
                              free(pvVar6);
                            }
                          }
                          else {
                            (*pAVar7->_vptr_Allocator[3])();
                          }
                        }
                      }
                      pBVar18[iVar11].shape.cstep = 0;
                      *(undefined8 *)((long)&pBVar18[iVar11].shape.refcount + 4) = 0;
                      *(undefined8 *)((long)&pBVar18[iVar11].shape.elemsize + 4) = 0;
                      pBVar18[iVar11].shape.data = (void *)0x0;
                      pBVar18[iVar11].shape.refcount = (int *)0x0;
                      pBVar18[iVar11].shape.dims = 0;
                      pBVar18[iVar11].shape.w = 0;
                      pBVar18[iVar11].shape.h = 0;
                      pBVar18[iVar11].shape.d = 0;
                      pBVar18[iVar11].shape.elemsize = 4;
                      pBVar18[iVar11].shape.elempack = 1;
                      pBVar18[iVar11].shape.allocator = (Allocator *)0x0;
                      pBVar18[iVar11].shape.dims = 1;
                      pBVar18[iVar11].shape.w = iVar12;
                      pBVar18[iVar11].shape.h = 1;
                      pBVar18[iVar11].shape.d = 1;
                      pBVar18[iVar11].shape.c = 1;
                      pBVar18[iVar11].shape.cstep = (long)iVar12;
                    }
                    lVar17 = lVar17 + 1;
                    piVar21 = piVar21 + 4;
                  } while (lVar17 < local_40c);
                }
                local_3d0 = &local_3f0->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (local_3d0,(long)local_400);
                if (0 < local_400) {
                  lVar22 = 0;
                  lVar17 = 0;
                  pvVar16 = local_3d0;
                  do {
                    iVar11 = (local_3b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar17];
                    pBVar18 = (pNVar20->d->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar8 = (pvVar16->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar1 = (undefined8 *)((long)&pMVar8->data + lVar22);
                    if ((Mat *)puVar1 != &pBVar18[iVar11].shape) {
                      piVar21 = pBVar18[iVar11].shape.refcount;
                      if (piVar21 != (int *)0x0) {
                        LOCK();
                        *piVar21 = *piVar21 + 1;
                        UNLOCK();
                      }
                      piVar21 = *(int **)((long)&pMVar8->refcount + lVar22);
                      if (piVar21 != (int *)0x0) {
                        LOCK();
                        *piVar21 = *piVar21 + -1;
                        UNLOCK();
                        if (*piVar21 == 0) {
                          pvVar6 = *(void **)((long)&pMVar8->data + lVar22);
                          plVar9 = *(long **)((long)&pMVar8->allocator + lVar22);
                          if (plVar9 == (long *)0x0) {
                            pvVar16 = local_3d0;
                            if (pvVar6 != (void *)0x0) {
                              free(pvVar6);
                              pvVar16 = local_3d0;
                            }
                          }
                          else {
                            (**(code **)(*plVar9 + 0x18))();
                            pvVar16 = local_3d0;
                          }
                        }
                      }
                      *(undefined8 *)((long)&pMVar8->cstep + lVar22) = 0;
                      *(undefined8 *)((long)puVar1 + 0xc) = 0;
                      *(undefined8 *)((long)puVar1 + 0x14) = 0;
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      puVar1 = (undefined8 *)((long)&pMVar8->dims + lVar22);
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      *(undefined4 *)((long)&pMVar8->c + lVar22) = 0;
                      piVar21 = pBVar18[iVar11].shape.refcount;
                      puVar1 = (undefined8 *)((long)&pMVar8->data + lVar22);
                      *puVar1 = pBVar18[iVar11].shape.data;
                      puVar1[1] = piVar21;
                      *(size_t *)((long)&pMVar8->elemsize + lVar22) = pBVar18[iVar11].shape.elemsize
                      ;
                      *(int *)((long)&pMVar8->elempack + lVar22) = pBVar18[iVar11].shape.elempack;
                      *(Allocator **)((long)&pMVar8->allocator + lVar22) =
                           pBVar18[iVar11].shape.allocator;
                      iVar12 = pBVar18[iVar11].shape.w;
                      iVar3 = pBVar18[iVar11].shape.h;
                      iVar4 = pBVar18[iVar11].shape.d;
                      piVar21 = (int *)((long)&pMVar8->dims + lVar22);
                      *piVar21 = pBVar18[iVar11].shape.dims;
                      piVar21[1] = iVar12;
                      piVar21[2] = iVar3;
                      piVar21[3] = iVar4;
                      *(int *)((long)&pMVar8->c + lVar22) = pBVar18[iVar11].shape.c;
                      *(size_t *)((long)&pMVar8->cstep + lVar22) = pBVar18[iVar11].shape.cstep;
                    }
                    lVar17 = lVar17 + 1;
                    lVar22 = lVar22 + 0x48;
                  } while (lVar17 < local_400);
                }
                local_3c8 = &local_3f0->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (local_3c8,(long)local_40c);
                if (0 < local_40c) {
                  lVar17 = 0;
                  lVar22 = 0;
                  do {
                    iVar11 = (local_3e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar22];
                    pBVar18 = (pNVar20->d->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar8 = (local_3c8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar1 = (undefined8 *)((long)&pMVar8->data + lVar17);
                    if ((Mat *)puVar1 != &pBVar18[iVar11].shape) {
                      piVar21 = pBVar18[iVar11].shape.refcount;
                      if (piVar21 != (int *)0x0) {
                        LOCK();
                        *piVar21 = *piVar21 + 1;
                        UNLOCK();
                      }
                      piVar21 = *(int **)((long)&pMVar8->refcount + lVar17);
                      if (piVar21 != (int *)0x0) {
                        LOCK();
                        *piVar21 = *piVar21 + -1;
                        UNLOCK();
                        if (*piVar21 == 0) {
                          pvVar6 = *(void **)((long)&pMVar8->data + lVar17);
                          plVar9 = *(long **)((long)&pMVar8->allocator + lVar17);
                          if (plVar9 == (long *)0x0) {
                            if (pvVar6 != (void *)0x0) {
                              free(pvVar6);
                            }
                          }
                          else {
                            (**(code **)(*plVar9 + 0x18))();
                          }
                        }
                      }
                      *(undefined8 *)((long)&pMVar8->cstep + lVar17) = 0;
                      *(undefined8 *)((long)puVar1 + 0xc) = 0;
                      *(undefined8 *)((long)puVar1 + 0x14) = 0;
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      puVar1 = (undefined8 *)((long)&pMVar8->dims + lVar17);
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      *(undefined4 *)((long)&pMVar8->c + lVar17) = 0;
                      piVar21 = pBVar18[iVar11].shape.refcount;
                      puVar1 = (undefined8 *)((long)&pMVar8->data + lVar17);
                      *puVar1 = pBVar18[iVar11].shape.data;
                      puVar1[1] = piVar21;
                      *(size_t *)((long)&pMVar8->elemsize + lVar17) = pBVar18[iVar11].shape.elemsize
                      ;
                      *(int *)((long)&pMVar8->elempack + lVar17) = pBVar18[iVar11].shape.elempack;
                      *(Allocator **)((long)&pMVar8->allocator + lVar17) =
                           pBVar18[iVar11].shape.allocator;
                      iVar12 = pBVar18[iVar11].shape.w;
                      iVar3 = pBVar18[iVar11].shape.h;
                      iVar4 = pBVar18[iVar11].shape.d;
                      piVar21 = (int *)((long)&pMVar8->dims + lVar17);
                      *piVar21 = pBVar18[iVar11].shape.dims;
                      piVar21[1] = iVar12;
                      piVar21[2] = iVar3;
                      piVar21[3] = iVar4;
                      *(int *)((long)&pMVar8->c + lVar17) = pBVar18[iVar11].shape.c;
                      *(size_t *)((long)&pMVar8->cstep + lVar17) = pBVar18[iVar11].shape.cstep;
                    }
                    lVar22 = lVar22 + 1;
                    lVar17 = lVar17 + 0x48;
                  } while (lVar22 < local_40c);
                }
                iVar11 = ParamDict::get(&local_3b0,0x1f,0);
                pLVar13 = local_3f0;
                local_3f0->featmask = iVar11;
                iVar11 = (*local_3f0->_vptr_Layer[2])(local_3f0,&local_3b0);
                if (iVar11 == 0) {
                  if (pLVar13->support_int8_storage == true) {
                    (local_408->opt).use_vulkan_compute = false;
                  }
                  get_masked_option((Option *)local_398,local_350,pLVar13->featmask);
                  if ((local_3f9 != '\0') &&
                     ((pLVar13->support_vulkan != true || (local_398[0x1f] == false)))) {
                    iVar11 = (*local_408->_vptr_Net[4])(local_408,local_238);
                    pLVar15 = (Layer *)CONCAT44(extraout_var_01,iVar11);
                    if (pLVar15 == (Layer *)0x0) {
                      pLVar15 = create_layer_cpu(local_238);
                    }
                    if (pLVar15 == (Layer *)0x0) {
                      iVar11 = (*local_408->_vptr_Net[3])(local_408,local_238);
                      pLVar15 = (Layer *)CONCAT44(extraout_var_02,iVar11);
                    }
                    if (pLVar15 == (Layer *)0x0) {
                      bVar2 = false;
                      fprintf(_stderr,"layer %s not exists or registered",local_238);
                      pLVar13 = local_3f0;
                      fputc(10,_stderr);
                      clear(local_408);
                      iVar11 = 1;
                    }
                    else {
                      std::__cxx11::string::_M_assign((string *)&pLVar15->type);
                      std::__cxx11::string::_M_assign((string *)&pLVar15->name);
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar15->bottoms,local_3b8)
                      ;
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar15->tops,local_3e8);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar15->bottom_shapes,local_3d0);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar15->top_shapes,local_3c8);
                      pLVar15->featmask = pLVar13->featmask;
                      iVar11 = (*pLVar15->_vptr_Layer[2])(pLVar15,&local_3b0);
                      if (iVar11 == 0) {
                        (*pLVar13->_vptr_Layer[1])(pLVar13);
                        iVar11 = 0;
                        bVar2 = true;
                        pLVar13 = pLVar15;
                      }
                      else {
                        load_param();
                        iVar11 = 0xe;
                        bVar2 = false;
                      }
                    }
                    if (!bVar2) goto LAB_0013bc31;
                  }
                  (local_408->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_3f8] = pLVar13;
                  iVar11 = 0;
                }
                else {
                  load_param();
                  iVar11 = 0xe;
                }
LAB_0013bc31:
                piVar21 = (int *)CONCAT44(local_338[0].refcount._4_4_,local_338[0].refcount._0_4_);
                if (piVar21 != (int *)0x0) {
                  LOCK();
                  *piVar21 = *piVar21 + -1;
                  UNLOCK();
                  if (*piVar21 == 0) {
                    if (local_338[0].allocator == (Allocator *)0x0) {
                      if ((size_t *)local_338[0].data != (size_t *)0x0) {
                        free(local_338[0].data);
                      }
                    }
                    else {
                      (*(local_338[0].allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_338[0].cstep = 0;
                local_338[0].data = (size_t *)0x0;
                local_338[0].refcount._0_4_ = 0;
                local_338[0].refcount._4_4_ = 0;
                local_338[0].elemsize._0_4_ = 0;
                local_338[0].elemsize._4_4_ = 0;
                local_338[0].elempack = 0;
                local_338[0].dims = 0;
                local_338[0].w = 0;
                local_338[0].h = 0;
                local_338[0].d = 0;
                local_338[0].c = 0;
              }
              else {
                load_param();
                iVar11 = 0xe;
              }
            }
          }
        }
      }
      else {
        load_param();
LAB_0013b598:
        iVar11 = 1;
      }
      if ((iVar11 != 0xe) && (iVar11 != 0)) goto LAB_0013bd72;
      local_3f8 = local_3f8 + 1;
    } while (local_3f8 < local_3dc);
    iVar11 = 0xc;
LAB_0013bd72:
    iVar12 = -1;
    this = local_408;
    if (iVar11 != 0xc) goto LAB_0013bd95;
  }
  NetPrivate::update_input_output_indexes(this->d);
  iVar12 = 0;
  NetPrivate::update_input_output_names(this->d);
LAB_0013bd95:
  ParamDict::~ParamDict(&local_3b0);
  return iVar12;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev)
        {
            int device_index = opt.vulkan_device_index;
            if (device_index < 0 || device_index >= get_gpu_count())
                device_index = get_default_gpu_index();

            d->vkdev = get_gpu_device(device_index);
        }
        if (!d->vkdev || !d->vkdev->is_valid()) opt.use_vulkan_compute = false; // no valid vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_uniform()) opt.use_fp16_uniform = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_packed()) opt.use_int8_packed = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_uniform()) opt.use_int8_uniform = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;
        if (!d->vkdev->info.support_subgroup_ops()) opt.use_subgroup_ops = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        if (opt.use_image_storage && !d->vkdev->info.support_fp16_image())
        {
            opt.use_fp16_storage = false;
            opt.use_fp16_uniform = false;
        }

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;

        // fp16 uniform makes no sense when fp16 arithmetic disabled
        if (!opt.use_fp16_arithmetic) opt.use_fp16_uniform = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_overwrite_builtin_layer(layer_type);
#if NCNN_VULKAN
        if (!layer && opt.use_vulkan_compute && d->vkdev)
        {
            layer = create_layer_vulkan(layer_type);
        }
#endif // NCNN_VULKAN
        if (!layer)
        {
            layer = create_layer_cpu(layer_type);
        }
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        int layer_support_vulkan = layer->support_vulkan;

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer_name);
            continue;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer_name);
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        if (layer_support_vulkan && (!layer->support_vulkan || !opt1.use_vulkan_compute))
        {
            // vulkan layer cannot handle these param, recreate cpu layer
            Layer* layer_cpu = create_overwrite_builtin_layer(layer_type);
            if (!layer_cpu)
            {
                layer_cpu = create_layer_cpu(layer_type);
            }
            if (!layer_cpu)
            {
                layer_cpu = create_custom_layer(layer_type);
            }
            if (!layer_cpu)
            {
                NCNN_LOGE("layer %s not exists or registered", layer_type);
                clear();
                return -1;
            }

            layer_cpu->type = layer->type;
            layer_cpu->name = layer->name;
            layer_cpu->bottoms = layer->bottoms;
            layer_cpu->tops = layer->tops;
            layer_cpu->bottom_shapes = layer->bottom_shapes;
            layer_cpu->top_shapes = layer->top_shapes;
            layer_cpu->featmask = layer->featmask;

            int lr = layer_cpu->load_param(pd);
            if (lr != 0)
            {
                NCNN_LOGE("layer load_param %d %s failed", i, layer_name);
                continue;
            }

            delete layer;
            layer = layer_cpu;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}